

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall symbols::LenFunction::LenFunction(LenFunction *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"len",&local_31);
  BuiltinFunction::BuiltinFunction(&this->super_BuiltinFunction,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_BuiltinFunction).super_BuiltinObject.super_Object._vptr_Object =
       (_func_int **)&PTR_type_001685b0;
  return;
}

Assistant:

LenFunction()
                :BuiltinFunction("len"){}